

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::temp_dir(void)

{
  char *pcVar1;
  Path *in_RDI;
  allocator local_d9;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  Pathie local_90 [32];
  char *local_70;
  char *env_value;
  allocator local_51;
  string local_50 [32];
  Pathie local_30 [8];
  string nstr;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"TMPDIR",&local_51);
  utf8_to_filename(local_30,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70 = (char *)0x0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  local_70 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"/tmp",&local_d9);
    Path(in_RDI,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    filename_to_utf8(local_90,(string *)local_b0);
    Path(in_RDI,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  local_b8 = 1;
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

Path Path::temp_dir()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = utf8_to_filename("TMPDIR"); // environment is encoded the same as paths
  char* env_value = NULL;

  if ((env_value = getenv(nstr.c_str()))) // Single = intended
    return Path(filename_to_utf8(env_value));


  return Path("/tmp"); // As per the Filesystem Hierarchy Standard.
#elif defined(_WIN32)
  wchar_t buf[MAX_PATH +1]; // See http://msdn.microsoft.com/en-us/library/windows/desktop/aa364992%28v=vs.85%29.aspx for the +1
  DWORD count = GetTempPathW(MAX_PATH + 1, buf);

  if (count == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::wstring utf16(buf, count);
  return utf16_to_utf8(utf16);
#else
#error Unsupported system.
#endif
}